

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase61::run(TestCase61 *this)

{
  byte bVar1;
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *this_00;
  bool destroyed2;
  bool destroyed1;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_37;
  Nested *local_30;
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> nested;
  
  destroyed1 = false;
  destroyed2 = false;
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&nested,&destroyed1);
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&_kjCondition,&destroyed2);
  this_00 = &(nested.ptr)->nested;
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator=
            (this_00,(Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)&_kjCondition);
  if (local_30 != (Nested *)0x0) {
    (***(_func_int ***)__kjCondition)();
  }
  bVar1 = 0;
  if (destroyed1 == false) {
    bVar1 = destroyed2 ^ 1;
  }
  _kjCondition.value = (bool)bVar1;
  if (((bVar1 & 1) == 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\", _kjCondition",
               (char (*) [45])"failed: expected !(destroyed1 || destroyed2)",&_kjCondition);
  }
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator=(&nested,this_00);
  __kjCondition = (bool *)&destroyed1;
  if (_::Debug::minSeverity < 3 && destroyed1 == false) {
    _::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x43,ERROR,"\"failed: expected \" \"destroyed1\", _kjCondition",
               (char (*) [28])"failed: expected destroyed1",(DebugExpression<bool_&> *)&_kjCondition
              );
  }
  __kjCondition = (bool *)(CONCAT71(uStack_37,destroyed2) ^ 1);
  if ((destroyed2 != false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x44,ERROR,"\"failed: expected \" \"!(destroyed2)\", _kjCondition",
               (char (*) [31])"failed: expected !(destroyed2)",&_kjCondition);
  }
  if (nested.ptr != (Nested *)0x0) {
    nested.ptr = (Nested *)0x0;
    (**(nested.disposer)->_vptr_Disposer)();
  }
  _kjCondition.value = (bool)(destroyed2 & destroyed1);
  if (((destroyed2 & destroyed1) == 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x46,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\", _kjCondition",
               (char (*) [42])"failed: expected destroyed1 && destroyed2",&_kjCondition.value);
  }
  if (nested.ptr != (Nested *)0x0) {
    nested.ptr = (Nested *)0x0;
    (**(nested.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}